

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<unsigned_short> __thiscall wasm::WATParser::Lexer::takeU<unsigned_short>(Lexer *this)

{
  bool bVar1;
  LexIntResult *pLVar2;
  size_type sVar3;
  unsigned_short local_52;
  string_view local_50;
  undefined1 local_40 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  Lexer *this_local;
  
  result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
  _32_8_ = this;
  local_50 = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40,local_50);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_40);
  if (bVar1) {
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40);
    bVar1 = anon_unknown_0::LexIntResult::isUnsigned<unsigned_short>(pLVar2);
    if (bVar1) {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40
                         );
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)pLVar2);
      this->pos = sVar3 + this->pos;
      advance(this);
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40
                         );
      local_52 = (unsigned_short)pLVar2->n;
      std::optional<unsigned_short>::optional<unsigned_short,_true>
                ((optional<unsigned_short> *)((long)&this_local + 4),&local_52);
      return (optional<unsigned_short>)this_local._4_4_;
    }
  }
  std::optional<unsigned_short>::optional((optional<unsigned_short> *)((long)&this_local + 4));
  return (_Optional_base<unsigned_short,_true,_true>)
         (_Optional_base<unsigned_short,_true,_true>)this_local._4_4_;
}

Assistant:

std::optional<T> Lexer::takeU() {
  static_assert(std::is_integral_v<T> && std::is_unsigned_v<T>);
  if (auto result = integer(next()); result && result->isUnsigned<T>()) {
    pos += result->span.size();
    advance();
    return T(result->n);
  }
  // TODO: Add error production for unsigned overflow.
  return std::nullopt;
}